

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

Vertex __thiscall geometrycentral::surface::SurfaceMesh::getNewVertex(SurfaceMesh *this)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  SurfaceMesh *in_RDI;
  function<void_(unsigned_long)> *f;
  iterator __end3;
  iterator __begin3;
  list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  *__range3;
  size_t newCapacity;
  reference in_stack_ffffffffffffffc0;
  _Self local_38;
  _Self local_30;
  size_type in_stack_ffffffffffffffd8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_10;
  
  if (in_RDI->nVerticesCapacityCount <= in_RDI->nVerticesFillCount) {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              (in_RDI->nVerticesCapacityCount << 1);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (this_00,in_stack_ffffffffffffffd8);
    bVar1 = usesImplicitTwin(in_RDI);
    if (!bVar1) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (this_00,in_stack_ffffffffffffffd8);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (this_00,in_stack_ffffffffffffffd8);
    }
    in_RDI->nVerticesCapacityCount = (size_t)this_00;
    local_30._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
         ::begin((list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                  *)in_RDI);
    local_38._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
         ::end((list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                *)in_RDI);
    while (bVar1 = ::std::operator!=(&local_30,&local_38), bVar1) {
      in_stack_ffffffffffffffc0 =
           ::std::_List_iterator<std::function<void_(unsigned_long)>_>::operator*
                     ((_List_iterator<std::function<void_(unsigned_long)>_> *)0x238e78);
      ::std::function<void_(unsigned_long)>::operator()
                (in_stack_ffffffffffffffc0,(unsigned_long)in_RDI);
      ::std::_List_iterator<std::function<void_(unsigned_long)>_>::operator++(&local_30);
    }
  }
  in_RDI->nVerticesFillCount = in_RDI->nVerticesFillCount + 1;
  in_RDI->nVerticesCount = in_RDI->nVerticesCount + 1;
  in_RDI->modificationTick = in_RDI->modificationTick + 1;
  in_RDI->isCompressedFlag = false;
  Vertex::Vertex((Vertex *)in_stack_ffffffffffffffc0,in_RDI,0x238eec);
  return (Vertex)local_10;
}

Assistant:

Vertex SurfaceMesh::getNewVertex() {

  // The boring case, when no resize is needed
  if (nVerticesFillCount < nVerticesCapacityCount) {
    // No work needed
  }
  // The intesting case, where vectors resize
  else {
    size_t newCapacity = nVerticesCapacityCount * 2;

    // Resize internal arrays
    vHalfedgeArr.resize(newCapacity);
    if (!usesImplicitTwin()) {
      vHeInStartArr.resize(newCapacity);
      vHeOutStartArr.resize(newCapacity);
    }

    nVerticesCapacityCount = newCapacity;


    // Invoke relevant callback functions
    for (auto& f : vertexExpandCallbackList) {
      f(newCapacity);
    }
  }

  nVerticesFillCount++;
  nVerticesCount++;

  modificationTick++;
  isCompressedFlag = false;
  return Vertex(this, nVerticesFillCount - 1);
}